

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.cc
# Opt level: O0

int BIO_hexdump(BIO *bio,uint8_t *data,size_t len,uint indent)

{
  int iVar1;
  undefined1 local_60 [8];
  hexdump_ctx ctx;
  uint indent_local;
  size_t len_local;
  uint8_t *data_local;
  BIO *bio_local;
  
  ctx._44_4_ = indent;
  OPENSSL_memset(local_60,0,0x30);
  ctx.n._0_4_ = ctx._44_4_;
  local_60 = (undefined1  [8])bio;
  iVar1 = hexdump_write((hexdump_ctx *)local_60,data,len);
  if ((iVar1 != 0) && (iVar1 = finish((hexdump_ctx *)local_60), iVar1 != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

int BIO_hexdump(BIO *bio, const uint8_t *data, size_t len, unsigned indent) {
  struct hexdump_ctx ctx;
  OPENSSL_memset(&ctx, 0, sizeof(ctx));
  ctx.bio = bio;
  ctx.indent = indent;

  if (!hexdump_write(&ctx, data, len) || !finish(&ctx)) {
    return 0;
  }

  return 1;
}